

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

char * aux_upvalue(TValue *fi,int n,TValue **val,GCObject **owner)

{
  GCObject *pGVar1;
  lua_CFunction p_Var2;
  long lVar3;
  byte bVar4;
  char *pcVar5;
  long lVar6;
  
  bVar4 = fi->tt_ & 0x3f;
  if (bVar4 == 6) {
    p_Var2 = (fi->value_).f;
    lVar3 = *(long *)(p_Var2 + 0x18);
    if (n - 1U < *(uint *)(lVar3 + 0x10)) {
      lVar6 = (long)(int)(n - 1U);
      *val = *(TValue **)(*(long *)(p_Var2 + lVar6 * 8 + 0x20) + 0x10);
      if (owner != (GCObject **)0x0) {
        *owner = *(GCObject **)(p_Var2 + lVar6 * 8 + 0x20);
      }
      lVar3 = *(long *)(*(long *)(lVar3 + 0x50) + lVar6 * 0x10);
      pcVar5 = "(no name)";
      if (lVar3 != 0) {
        pcVar5 = (char *)(lVar3 + 0x18);
      }
      return pcVar5;
    }
  }
  else if (bVar4 == 0x26) {
    pGVar1 = (fi->value_).gc;
    if (n - 1U < (uint)(byte)pGVar1->field_0xa) {
      *val = (TValue *)(pGVar1 + (ulong)(n - 1U) + 2);
      if (owner == (GCObject **)0x0) {
        return "";
      }
      *owner = pGVar1;
      return "";
    }
  }
  return (char *)0x0;
}

Assistant:

static const char *aux_upvalue (TValue *fi, int n, TValue **val,
                                GCObject **owner) {
  switch (ttypetag(fi)) {
    case LUA_VCCL: {  /* C closure */
      CClosure *f = clCvalue(fi);
      if (!(cast_uint(n) - 1u < cast_uint(f->nupvalues)))
        return NULL;  /* 'n' not in [1, f->nupvalues] */
      *val = &f->upvalue[n-1];
      if (owner) *owner = obj2gco(f);
      return "";
    }
    case LUA_VLCL: {  /* Lua closure */
      LClosure *f = clLvalue(fi);
      TString *name;
      Proto *p = f->p;
      if (!(cast_uint(n) - 1u  < cast_uint(p->sizeupvalues)))
        return NULL;  /* 'n' not in [1, p->sizeupvalues] */
      *val = f->upvals[n-1]->v.p;
      if (owner) *owner = obj2gco(f->upvals[n - 1]);
      name = p->upvalues[n-1].name;
      return (name == NULL) ? "(no name)" : getstr(name);
    }
    default: return NULL;  /* not a closure */
  }
}